

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::
     MapBindIdentifierFromElement<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
               (ParseNodePtr elementNode,anon_class_32_4_343c1aa9 handler)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  
  if (elementNode->nop == knopEllipsis) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (elementNode->nop != knopAsg) goto LAB_0083972a;
    pPVar4 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar4->pnode1;
LAB_0083972a:
  OVar1 = elementNode->nop;
  if ((OVar1 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
              (elementNode,handler);
    return;
  }
  if ((byte)(OVar1 + ~knopList) < 3) {
    AddArgsToScope::anon_class_32_4_343c1aa9::operator()(&handler,elementNode);
  }
  else if (OVar1 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }